

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_send(ptls_t *tls,ptls_buffer_t *sendbuf,void *_input,size_t inlen)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t inlen_00;
  undefined2 local_3b;
  undefined1 local_39;
  size_t enc_size;
  
  if (tls->state != PTLS_STATE_CLIENT_SEND_EARLY_DATA &&
      tls->state < PTLS_STATE_SERVER_EXPECT_FINISHED) {
    __assert_fail("tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                  ,0x944,"int ptls_send(ptls_t *, ptls_buffer_t *, const void *, size_t)");
  }
  bVar1 = *(byte *)&(tls->field_7).server;
  if ((bVar1 & 1) != 0) {
    *(byte *)&(tls->field_7).server = bVar1 & 0xfe;
    iVar3 = send_session_ticket(tls,sendbuf);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  while( true ) {
    if (inlen == 0) {
      return 0;
    }
    inlen_00 = 0x4000;
    if (inlen < 0x4000) {
      inlen_00 = inlen;
    }
    local_3b = 0x317;
    local_39 = 1;
    iVar3 = ptls_buffer__do_pushv(sendbuf,&local_3b,3);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar3 != 0) {
      return iVar3;
    }
    sVar2 = sendbuf->off;
    iVar3 = ptls_buffer_reserve(sendbuf,inlen_00 + 0x100);
    if (iVar3 != 0) break;
    iVar3 = ptls_aead_transform((tls->traffic_protection).enc.aead,sendbuf->base + sendbuf->off,
                                &enc_size,_input,inlen_00,'\x17');
    if (iVar3 != 0) {
      return iVar3;
    }
    sVar4 = sendbuf->off + enc_size;
    sendbuf->off = sVar4;
    lVar5 = sVar4 - sVar2;
    sendbuf->base[sVar2 - 2] = (uint8_t)((ulong)lVar5 >> 8);
    sendbuf->base[sVar2 - 1] = (uint8_t)lVar5;
    _input = (void *)((long)_input + inlen_00);
    inlen = inlen - inlen_00;
  }
  return iVar3;
}

Assistant:

int ptls_send(ptls_t *tls, ptls_buffer_t *sendbuf, const void *_input, size_t inlen)
{
    const uint8_t *input = (const uint8_t *)_input;
    size_t pt_size, enc_size;
    int ret = 0;

    assert(tls->state >= PTLS_STATE_SERVER_EXPECT_FINISHED || tls->state == PTLS_STATE_CLIENT_SEND_EARLY_DATA);

    if (tls->server.send_ticket) {
        tls->server.send_ticket = 0;
        if ((ret = send_session_ticket(tls, sendbuf)) != 0)
            goto Exit;
    }

    for (; inlen != 0; input += pt_size, inlen -= pt_size) {
        pt_size = inlen;
        if (pt_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            pt_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_APPDATA, {
            if ((ret = ptls_buffer_reserve(sendbuf, pt_size + 256)) != 0)
                goto Exit;
            if ((ret = ptls_aead_transform(tls->traffic_protection.enc.aead, sendbuf->base + sendbuf->off, &enc_size, input,
                                           pt_size, PTLS_CONTENT_TYPE_APPDATA)) != 0)
                goto Exit;
            sendbuf->off += enc_size;
        });
    }

Exit:
    return ret;
}